

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_insert(CuTest *tc)

{
  int iVar1;
  char *actual;
  char *str;
  critbit_tree cStack_18;
  int result;
  critbit_tree cb;
  CuTest *tc_local;
  
  cb.root = tc;
  memset(&stack0xffffffffffffffe8,0,8);
  iVar1 = cb_insert(&stack0xffffffffffffffe8,"herpderp",9);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x19,(char *)0x0,0,iVar1);
  CuAssert_Line((CuTest *)cb.root,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x1a,"null pointer unexpected",(uint)(cStack_18.root != (void *)0x0));
  iVar1 = cb_insert(&stack0xffffffffffffffe8,"herpderp",9);
  CuAssertIntEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x1d,(char *)0x0,1,iVar1);
  actual = (char *)cb_find(&stack0xffffffffffffffe8,"herpderp",9);
  CuAssertStrEquals_LineMsg
            ((CuTest *)cb.root,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x20,(char *)0x0,"herpderp",actual);
  cb_clear(&stack0xffffffffffffffe8);
  return;
}

Assistant:

static void test_insert(CuTest * tc)
{
    struct selist *ql = NULL;
    int i;
    for (i = 0; i != 32; ++i) {
        CuAssertIntEquals(tc, i, selist_length(ql));
        selist_insert(&ql, 0, (void *)(lipsum + 31 - i));
    }
    for (i = 0; i != 32; ++i) {
        CuAssertPtrEquals(tc, (void *)(lipsum + i), selist_get(ql, i));
    }
    selist_free(ql);
}